

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update7_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  C_Integer *pCVar8;
  char *pcVar9;
  bool bVar10;
  global_array_t *pgVar11;
  int iVar12;
  Integer proc;
  logical lVar13;
  long lVar14;
  ulong *proclist;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  C_Integer CVar25;
  long lVar26;
  Integer _last;
  long lVar27;
  long lVar28;
  long lVar29;
  int _ndim_4;
  ulong uVar30;
  long lVar31;
  ulong proc_00;
  int local_5b0;
  int _ndim;
  int _index [7];
  Integer *local_538;
  Integer _hi [7];
  Integer np;
  int stride_rem [7];
  int stride_loc [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  pgVar11 = GA;
  if (lVar13 != 0) {
    lVar1 = g_a + 1000;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    lVar31 = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    if (0 < lVar31) {
      memcpy(width,GA[g_a + 1000].width,lVar31 * 8);
      memcpy(dims,pgVar11[g_a + 1000].dims,lVar31 * 8);
    }
    lVar13 = gai_check_ghost_distr(g_a);
    if (lVar13 == 0) {
      return 0;
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar29 = 1;
    lVar14 = lVar31;
    if (0 < sVar2) {
      do {
        lVar29 = lVar29 * 3;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    lVar14 = 0;
    local_538 = (Integer *)0x0;
    proclist = (ulong *)0x0;
    do {
      if (0 < sVar2) {
        bVar10 = true;
        lVar28 = 0;
        lVar19 = lVar14;
        do {
          lVar22 = ~((lVar19 / 3) * 3) + lVar19;
          if (lVar22 != 0) {
            bVar10 = false;
          }
          mask[lVar28] = lVar22;
          lVar28 = lVar28 + 1;
          lVar19 = lVar19 / 3;
        } while (lVar31 != lVar28);
        if (!bVar10) {
          if (0 < sVar2) {
            lVar19 = 0;
            bVar10 = false;
            do {
              if ((mask[lVar19] != 0) && (width[lVar19] == 0)) {
                bVar10 = true;
              }
              lVar19 = lVar19 + 1;
            } while (lVar31 != lVar19);
            if (bVar10) goto LAB_0018f961;
          }
          if (0 < sVar2) {
            lVar19 = 0;
            do {
              lVar28 = mask[lVar19];
              if (lVar28 == -1) {
                lVar28 = lo_loc[lVar19];
                if (1 < lVar28) {
                  tlo_rem[lVar19] = lVar28 - width[lVar19];
                  lVar28 = lVar28 + -1;
                  goto LAB_0018ec33;
                }
                thi_rem[lVar19] = dims[lVar19];
                tlo_rem[lVar19] = (dims[lVar19] - width[lVar19]) + 1;
              }
              else {
                if (lVar28 == 1) {
                  lVar28 = hi_loc[lVar19];
                  if (lVar28 < dims[lVar19]) {
                    tlo_rem[lVar19] = lVar28 + 1;
                    lVar28 = lVar28 + width[lVar19];
                  }
                  else {
                    tlo_rem[lVar19] = 1;
                    lVar28 = width[lVar19];
                  }
                }
                else {
                  if (lVar28 != 0) {
                    pnga_update7_ghosts_cold_1();
                    goto LAB_0018ec3b;
                  }
                  tlo_rem[lVar19] = lo_loc[lVar19];
                  lVar28 = hi_loc[lVar19];
                }
LAB_0018ec33:
                thi_rem[lVar19] = lVar28;
              }
LAB_0018ec3b:
              lVar19 = lVar19 + 1;
            } while (lVar31 != lVar19);
          }
          local_538 = (Integer *)malloc(GAnproc * 0x70 | 8);
          if (local_538 == (Integer *)0x0) {
            pnga_error("pnga_update7_ghosts:malloc failed (_ga_map)",0);
          }
          proclist = (ulong *)malloc(GAnproc << 3);
          if (proclist == (ulong *)0x0) {
            pnga_error("pnga_update7_ghosts:malloc failed (_ga_proclist)",0);
          }
          lVar13 = pnga_locate_region(g_a,tlo_rem,thi_rem,local_538,(Integer *)proclist,&np);
          if (lVar13 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar15 = strlen(err_string);
            sprintf(err_string + (int)sVar15," [%ld:%ld ",tlo_rem[0],thi_rem[0]);
            sVar15 = strlen(err_string);
            iVar12 = (int)sVar15;
            IVar16 = pnga_ndim(g_a);
            if (1 < IVar16) {
              lVar19 = 1;
              do {
                sprintf(err_string + (int)sVar15,",%ld:%ld ",tlo_rem[lVar19],thi_rem[lVar19]);
                sVar15 = strlen(err_string);
                iVar12 = (int)sVar15;
                lVar19 = lVar19 + 1;
                IVar16 = pnga_ndim(g_a);
              } while (lVar19 < IVar16);
            }
            (err_string + iVar12)[0] = ']';
            (err_string + iVar12)[1] = '\0';
            pnga_error(err_string,g_a);
          }
          if (1 < np) {
            pnga_update7_ghosts_cold_2();
          }
          proc_00 = *proclist;
          pnga_distribution(g_a,proc_00,tlo_rem,thi_rem);
          pgVar11 = GA;
          if (0 < sVar2) {
            lVar19 = 0;
            do {
              lVar28 = mask[lVar19];
              if (lVar28 == -1) {
                plo_loc[lVar19] = 0;
                phi_loc[lVar19] = width[lVar19] + -1;
                lVar28 = (thi_rem[lVar19] - tlo_rem[lVar19]) + 1;
LAB_0018ef03:
                plo_rem[lVar19] = lVar28;
              }
              else {
                if (lVar28 == 1) {
                  lVar28 = width[lVar19];
                  plo_loc[lVar19] = lVar28 + (hi_loc[lVar19] - lo_loc[lVar19]) + 1;
                  lVar22 = (hi_loc[lVar19] - lo_loc[lVar19]) + lVar28 * 2;
LAB_0018eec7:
                  phi_loc[lVar19] = lVar22;
                  goto LAB_0018ef03;
                }
                if (lVar28 == 0) {
                  lVar28 = width[lVar19];
                  plo_loc[lVar19] = lVar28;
                  lVar22 = (hi_loc[lVar19] + lVar28) - lo_loc[lVar19];
                  goto LAB_0018eec7;
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar31 != lVar19);
          }
          uVar3 = GA[lVar1].ndim;
          uVar30 = (ulong)(short)uVar3;
          iVar12 = GA[lVar1].distr_type;
          if (iVar12 - 1U < 3) {
            uVar23 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar3) {
              uVar23 = uVar23 & 0xffffffff;
              lVar19 = 0;
              IVar16 = proc;
              do {
                IVar16 = (long)((int)IVar16 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar19];
                uVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar19 + 1];
                _index[lVar19 + 1] = (int)uVar23;
                lVar19 = lVar19 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar19);
            }
            if (0 < (short)uVar3) {
              lVar19 = 0;
              do {
                iVar21 = *(int *)((long)_index + lVar19);
                lVar28 = *(long *)((long)GA[g_a + 1000].block_dims + lVar19 * 2);
                *(long *)(err_string + lVar19 * 2) = lVar28 * iVar21 + 1;
                lVar28 = ((long)iVar21 + 1) * lVar28;
                *(long *)((long)_hi + lVar19 * 2) = lVar28;
                lVar22 = *(long *)((long)GA[g_a + 1000].dims + lVar19 * 2);
                if (lVar22 <= lVar28) {
                  lVar28 = lVar22;
                }
                *(long *)((long)_hi + lVar19 * 2) = lVar28;
                lVar19 = lVar19 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar19);
            }
          }
          else if (iVar12 == 4) {
            uVar23 = (long)(int)proc % GA[lVar1].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar3) {
              uVar23 = uVar23 & 0xffffffff;
              lVar19 = 0;
              IVar16 = proc;
              do {
                IVar16 = (long)((int)IVar16 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar19];
                uVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar19 + 1];
                _index[lVar19 + 1] = (int)uVar23;
                lVar19 = lVar19 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar19);
            }
            if (0 < (short)uVar3) {
              pCVar8 = GA[lVar1].mapc;
              lVar19 = 0;
              iVar21 = 0;
              do {
                iVar18 = *(int *)((long)_index + lVar19);
                lVar28 = (long)iVar21 + (long)iVar18;
                *(C_Integer *)(err_string + lVar19 * 2) = pCVar8[lVar28];
                if ((long)iVar18 < *(long *)((long)GA[lVar1].num_blocks + lVar19 * 2) + -1) {
                  lVar28 = GA[lVar1].mapc[lVar28 + 1] + -1;
                }
                else {
                  lVar28 = *(long *)((long)GA[lVar1].dims + lVar19 * 2);
                }
                *(long *)((long)_hi + lVar19 * 2) = lVar28;
                iVar21 = iVar21 + *(int *)((long)GA[lVar1].num_blocks + lVar19 * 2);
                lVar19 = lVar19 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar19);
            }
          }
          else if (iVar12 == 0) {
            if (GA[lVar1].num_rstrctd == 0) {
              if ((short)uVar3 < 1) {
                lVar19 = 1;
              }
              else {
                lVar19 = 1;
                uVar23 = 0;
                do {
                  lVar19 = lVar19 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar30 != uVar23);
              }
              if ((-1 < proc) && (proc < lVar19)) {
                if (0 < (short)uVar3) {
                  pCVar8 = GA[lVar1].mapc;
                  uVar23 = 0;
                  lVar19 = 0;
                  IVar16 = proc;
                  do {
                    lVar22 = (long)GA[g_a + 1000].nblock[uVar23];
                    lVar28 = IVar16 % lVar22;
                    hi_loc[uVar23 - 0x20] = pCVar8[lVar28 + lVar19];
                    if (lVar28 == lVar22 + -1) {
                      CVar25 = GA[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar25 = pCVar8[lVar28 + lVar19 + 1] + -1;
                    }
                    lVar19 = lVar19 + lVar22;
                    _hi[uVar23] = CVar25;
                    uVar23 = uVar23 + 1;
                    IVar16 = IVar16 / lVar22;
                  } while (uVar30 != uVar23);
                }
                goto LAB_0018f2e7;
              }
            }
            else if (proc < GA[lVar1].num_rstrctd) {
              if ((short)uVar3 < 1) {
                lVar19 = 1;
              }
              else {
                lVar19 = 1;
                uVar23 = 0;
                do {
                  lVar19 = lVar19 * GA[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar30 != uVar23);
              }
              if ((-1 < proc) && (proc < lVar19)) {
                if (0 < (short)uVar3) {
                  pCVar8 = GA[lVar1].mapc;
                  lVar19 = 0;
                  uVar23 = 0;
                  IVar16 = proc;
                  do {
                    lVar22 = (long)GA[g_a + 1000].nblock[uVar23];
                    lVar28 = IVar16 % lVar22;
                    hi_loc[uVar23 - 0x20] = pCVar8[lVar28 + lVar19];
                    if (lVar28 == lVar22 + -1) {
                      CVar25 = GA[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar25 = pCVar8[lVar28 + lVar19 + 1] + -1;
                    }
                    lVar19 = lVar19 + lVar22;
                    _hi[uVar23] = CVar25;
                    uVar23 = uVar23 + 1;
                    IVar16 = IVar16 / lVar22;
                  } while (uVar30 != uVar23);
                }
                goto LAB_0018f2e7;
              }
            }
            if (0 < (short)uVar3) {
              memset(err_string,0,uVar30 * 8);
              memset(_hi,0xff,uVar30 * 8);
            }
          }
LAB_0018f2e7:
          if (uVar30 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
          }
          if ((short)uVar3 < 2) {
            lVar28 = 1;
            lVar19 = 0;
          }
          else {
            lVar28 = 1;
            lVar22 = 0;
            lVar19 = 0;
            do {
              lVar19 = lVar19 + plo_loc[lVar22] * lVar28;
              lVar27 = (_hi[lVar22] - hi_loc[lVar22 + -0x20]) +
                       pgVar11[g_a + 1000].width[lVar22] * 2 + 1;
              ld_loc[lVar22] = lVar27;
              lVar28 = lVar28 * lVar27;
              lVar22 = lVar22 + 1;
            } while (uVar30 - 1 != lVar22);
          }
          lVar22 = *(long *)(count + uVar30 * 2 + 6);
          ppcVar6 = pgVar11[lVar1].ptr;
          iVar21 = pgVar11[lVar1].elemsize;
          pcVar7 = ppcVar6[proc];
          local_5b0 = (int)proc_00;
          if (iVar12 - 1U < 3) {
            uVar23 = (long)local_5b0 % pgVar11[lVar1].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar3) {
              uVar23 = uVar23 & 0xffffffff;
              lVar27 = 0;
              uVar17 = proc_00;
              do {
                uVar17 = (long)((int)uVar17 - (int)uVar23) / pgVar11[g_a + 1000].num_blocks[lVar27];
                uVar23 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar27 + 1];
                _index[lVar27 + 1] = (int)uVar23;
                lVar27 = lVar27 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar27);
            }
            if (0 < (short)uVar3) {
              lVar27 = 0;
              do {
                iVar12 = *(int *)((long)_index + lVar27);
                lVar24 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar27 * 2);
                *(long *)(err_string + lVar27 * 2) = lVar24 * iVar12 + 1;
                lVar24 = ((long)iVar12 + 1) * lVar24;
                *(long *)((long)_hi + lVar27 * 2) = lVar24;
                lVar20 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar27 * 2);
                if (lVar20 <= lVar24) {
                  lVar24 = lVar20;
                }
                *(long *)((long)_hi + lVar27 * 2) = lVar24;
                lVar27 = lVar27 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar27);
            }
          }
          else if (iVar12 == 4) {
            uVar23 = (long)local_5b0 % pgVar11[lVar1].num_blocks[0];
            _index[0] = (int)uVar23;
            if (1 < (short)uVar3) {
              uVar23 = uVar23 & 0xffffffff;
              lVar27 = 0;
              uVar17 = proc_00;
              do {
                uVar17 = (long)((int)uVar17 - (int)uVar23) / pgVar11[g_a + 1000].num_blocks[lVar27];
                uVar23 = (long)(int)uVar17 % pgVar11[g_a + 1000].num_blocks[lVar27 + 1];
                _index[lVar27 + 1] = (int)uVar23;
                lVar27 = lVar27 + 1;
              } while ((uVar30 & 0xffffffff) - 1 != lVar27);
            }
            if (0 < (short)uVar3) {
              pCVar8 = pgVar11[lVar1].mapc;
              lVar27 = 0;
              iVar12 = 0;
              do {
                iVar18 = *(int *)((long)_index + lVar27);
                lVar24 = (long)iVar12 + (long)iVar18;
                *(C_Integer *)(err_string + lVar27 * 2) = pCVar8[lVar24];
                if ((long)iVar18 < *(long *)((long)pgVar11[lVar1].num_blocks + lVar27 * 2) + -1) {
                  lVar24 = pgVar11[lVar1].mapc[lVar24 + 1] + -1;
                }
                else {
                  lVar24 = *(long *)((long)pgVar11[lVar1].dims + lVar27 * 2);
                }
                *(long *)((long)_hi + lVar27 * 2) = lVar24;
                iVar12 = iVar12 + *(int *)((long)pgVar11[lVar1].num_blocks + lVar27 * 2);
                lVar27 = lVar27 + 4;
              } while ((uVar30 & 0xffffffff) << 2 != lVar27);
            }
          }
          else if (iVar12 == 0) {
            if (pgVar11[lVar1].num_rstrctd == 0) {
              if ((short)uVar3 < 1) {
                lVar27 = 1;
              }
              else {
                lVar27 = 1;
                uVar23 = 0;
                do {
                  lVar27 = lVar27 * pgVar11[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar30 != uVar23);
              }
              if (((long)proc_00 < 0) || (lVar27 <= (long)proc_00)) {
LAB_0018f749:
                if (0 < (short)uVar3) {
                  memset(err_string,0,uVar30 << 3);
LAB_0018f778:
                  memset(_hi,0xff,uVar30 << 3);
                }
              }
              else if (0 < (short)uVar3) {
                pCVar8 = pgVar11[lVar1].mapc;
                lVar27 = 0;
                uVar17 = 0;
                uVar23 = proc_00;
                do {
                  lVar20 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                  lVar24 = (long)uVar23 % lVar20;
                  hi_loc[uVar17 - 0x20] = pCVar8[lVar24 + lVar27];
                  if (lVar24 == lVar20 + -1) {
                    CVar25 = pgVar11[g_a + 1000].dims[uVar17];
                  }
                  else {
                    CVar25 = pCVar8[lVar24 + lVar27 + 1] + -1;
                  }
                  lVar27 = lVar27 + lVar20;
                  _hi[uVar17] = CVar25;
                  uVar17 = uVar17 + 1;
                  uVar23 = (long)uVar23 / lVar20;
                } while (uVar30 != uVar17);
              }
            }
            else if ((long)proc_00 < pgVar11[lVar1].num_rstrctd) {
              if ((short)uVar3 < 1) {
                lVar27 = 1;
              }
              else {
                lVar27 = 1;
                uVar23 = 0;
                do {
                  lVar27 = lVar27 * pgVar11[g_a + 1000].nblock[uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar30 != uVar23);
              }
              if (((long)proc_00 < 0) || (lVar27 <= (long)proc_00)) goto LAB_0018f749;
              if (0 < (short)uVar3) {
                pCVar8 = pgVar11[lVar1].mapc;
                lVar27 = 0;
                uVar17 = 0;
                uVar23 = proc_00;
                do {
                  lVar20 = (long)pgVar11[g_a + 1000].nblock[uVar17];
                  lVar24 = (long)uVar23 % lVar20;
                  hi_loc[uVar17 - 0x20] = pCVar8[lVar24 + lVar27];
                  if (lVar24 == lVar20 + -1) {
                    CVar25 = pgVar11[g_a + 1000].dims[uVar17];
                  }
                  else {
                    CVar25 = pCVar8[lVar24 + lVar27 + 1] + -1;
                  }
                  lVar27 = lVar27 + lVar20;
                  _hi[uVar17] = CVar25;
                  uVar17 = uVar17 + 1;
                  uVar23 = (long)uVar23 / lVar20;
                } while (uVar30 != uVar17);
              }
            }
            else if (0 < (short)uVar3) {
              memset(err_string,0,(ulong)uVar3 << 3);
              goto LAB_0018f778;
            }
          }
          if (uVar30 == 1) {
            ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
          }
          if ((short)uVar3 < 2) {
            lVar24 = 1;
            lVar27 = 0;
          }
          else {
            lVar24 = 1;
            lVar27 = 0;
            lVar20 = 0;
            do {
              lVar27 = lVar27 + plo_rem[lVar20] * lVar24;
              lVar26 = (_hi[lVar20] - hi_loc[lVar20 + -0x20]) +
                       pgVar11[g_a + 1000].width[lVar20] * 2 + 1;
              ld_rem[lVar20] = lVar26;
              lVar24 = lVar24 * lVar26;
              lVar20 = lVar20 + 1;
            } while (uVar30 - 1 != lVar20);
          }
          lVar20 = plo_rem[uVar30 - 1];
          pcVar9 = ppcVar6[proc_00];
          stride_loc[0] = iVar4;
          stride_rem[0] = iVar4;
          if (1 < sVar2) {
            lVar26 = 0;
            iVar12 = iVar4;
            iVar18 = iVar4;
            do {
              iVar18 = iVar18 * (int)ld_rem[lVar26];
              stride_rem[lVar26] = iVar18;
              iVar12 = iVar12 * (int)ld_loc[lVar26];
              stride_loc[lVar26] = iVar12;
              stride_rem[lVar26 + 1] = iVar18;
              stride_loc[lVar26 + 1] = iVar12;
              lVar26 = lVar26 + 1;
            } while (lVar31 + -1 != lVar26);
          }
          if (0 < sVar2) {
            lVar26 = 0;
            do {
              count[lVar26] = ((int)phi_loc[lVar26] - (int)plo_loc[lVar26]) + 1;
              lVar26 = lVar26 + 1;
            } while (lVar31 != lVar26);
          }
          count[0] = count[0] * iVar4;
          if (-1 < iVar5) {
            proc_00 = (ulong)(uint)PGRP_LIST[iVar5].inv_map_proc_list[proc_00];
          }
          ARMCI_NbGetS(pcVar9 + (lVar24 * lVar20 + lVar27) * (long)iVar21,stride_rem,
                       pcVar7 + (lVar28 * lVar22 + lVar19) * (long)iVar21,stride_loc,count,
                       (int)(lVar31 + -1),(int)proc_00,(armci_hdl_t *)0x0);
        }
      }
LAB_0018f961:
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar29 + (ulong)(lVar29 == 0));
    ARMCI_WaitAll();
    free(local_538);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update7_ghosts(Integer g_a)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return TRUE;
  }

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all GET operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    /*if (itmp>1) mask0 = TRUE; */
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor from which it is coming. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }

    _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
    if(!_ga_map) pnga_error("pnga_update7_ghosts:malloc failed (_ga_map)",0);
    _ga_proclist = malloc(GAnproc*sizeof(Integer));
    if(!_ga_proclist) pnga_error("pnga_update7_ghosts:malloc failed (_ga_proclist)",0);

    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to send
       data to it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;

    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    /* put data on remote processor */
/*    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem); */
    ARMCI_NbGetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem, NULL);
  }

  ARMCI_WaitAll();
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}